

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeT2MOVTWInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  DecodeStatus DVar4;
  DecodeStatus DVar5;
  
  uVar3 = Insn >> 8 & 0xf;
  uVar2 = MCInst_getOpcode(Inst);
  if (uVar2 == 0x988) {
    uVar1 = GPRDecoderTable[uVar3];
    MCOperand_CreateReg0(Inst,(uint)uVar1);
    DVar5 = (uint)((Insn & 0xd00) != 0xd00) * 2 + MCDisassembler_SoftFail;
  }
  else {
    uVar1 = GPRDecoderTable[uVar3];
    DVar5 = MCDisassembler_Success;
  }
  MCOperand_CreateReg0(Inst,(uint)uVar1);
  DVar4 = MCDisassembler_SoftFail;
  if ((Insn & 0xd00) != 0xd00) {
    DVar4 = DVar5;
  }
  MCOperand_CreateImm0(Inst,(ulong)(Insn >> 0xf & 0x800 | Insn >> 4 & 0xf700 | Insn & 0xff));
  return DVar4;
}

Assistant:

static DecodeStatus DecodeT2MOVTWInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rd = fieldFromInstruction_4(Insn, 8, 4);
	unsigned imm = 0;

	imm |= (fieldFromInstruction_4(Insn, 0, 8) << 0);
	imm |= (fieldFromInstruction_4(Insn, 12, 3) << 8);
	imm |= (fieldFromInstruction_4(Insn, 16, 4) << 12);
	imm |= (fieldFromInstruction_4(Insn, 26, 1) << 11);

	if (MCInst_getOpcode(Inst) == ARM_t2MOVTi16)
		if (!Check(&S, DecoderGPRRegisterClass(Inst, Rd, Address, Decoder)))
			return MCDisassembler_Fail;
	if (!Check(&S, DecoderGPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;

	MCOperand_CreateImm0(Inst, imm);

	return S;
}